

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

void treatstackoption(lua_State *L,lua_State *L1,char *fname)

{
  if (L == L1) {
    lua_pushvalue(L,-2);
    lua_remove(L,-3);
  }
  else {
    lua_xmove(L1,L,1);
  }
  lua_setfield(L,-2,fname);
  return;
}

Assistant:

static void treatstackoption (lua_State *L, lua_State *L1, const char *fname) {
  if (L == L1) {
    lua_pushvalue(L, -2);
    lua_remove(L, -3);
  }
  else
    lua_xmove(L1, L, 1);
  lua_setfield(L, -2, fname);
}